

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O0

char ** Dar_Permutations(int n)

{
  int nCols;
  char **pRes_00;
  int local_58;
  int i;
  int nFact;
  char **pRes;
  char Array [50];
  int n_local;
  
  nCols = Dar_Factorial(n);
  pRes_00 = Dar_ArrayAlloc(nCols,n,1);
  for (local_58 = 0; local_58 < n; local_58 = local_58 + 1) {
    Array[(long)local_58 + -8] = (char)local_58;
  }
  Dar_Permutations_rec(pRes_00,nCols,n,(char *)&pRes);
  return pRes_00;
}

Assistant:

char ** Dar_Permutations( int n )
{
    char Array[50];
    char ** pRes;
    int nFact, i;
    // allocate memory
    nFact = Dar_Factorial( n );
    pRes  = Dar_ArrayAlloc( nFact, n, sizeof(char) );
    // fill in the permutations
    for ( i = 0; i < n; i++ )
        Array[i] = i;
    Dar_Permutations_rec( pRes, nFact, n, Array );
    // print the permutations
/*
    {
    int i, k;
    for ( i = 0; i < nFact; i++ )
    {
        printf( "{" );
        for ( k = 0; k < n; k++ )
            printf( " %d", pRes[i][k] );
        printf( " }\n" );
    }
    }
*/
    return pRes;
}